

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O3

void do_cmd_choose_class(command *cmd)

{
  undefined8 in_RAX;
  player_class *c;
  int *inc;
  long lVar1;
  int *spent;
  player *p;
  wchar_t choice;
  guid local_14;
  
  local_14 = (guid)((ulong)in_RAX >> 0x20);
  cmd_get_arg_choice((command_conflict *)cmd,"choice",(int *)&local_14);
  p = player;
  c = player_id2class(local_14);
  lVar1 = 0;
  spent = (int *)0x0;
  player_generate(p,(player_race *)0x0,c,false);
  points_left = L'\x14';
  points_spent[0] = 0;
  points_spent[1] = 0;
  points_spent[2] = 0;
  points_spent[3] = 0;
  points_spent[4] = 0;
  do {
    *(undefined4 *)((long)stats + lVar1) = 10;
    *(undefined4 *)((long)points_inc + lVar1) = 1;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x14);
  generate_stats((int *)p,spent,inc,points_inc);
  rolled_stats = 0;
  return;
}

Assistant:

void do_cmd_choose_class(struct command *cmd)
{
	int choice;
	cmd_get_arg_choice(cmd, "choice", &choice);
	player_generate(player, NULL, player_id2class(choice), false);

	reset_stats(stats, points_spent, points_inc, &points_left, false);
	generate_stats(stats, points_spent, points_inc, &points_left);
	rolled_stats = false;
}